

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O2

FilterPolicy * leveldb::NewBloomFilterPolicy(int bits_per_key)

{
  FilterPolicy *pFVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  
  pFVar1 = (FilterPolicy *)operator_new(0x18);
  pFVar1->_vptr_FilterPolicy = (_func_int **)&PTR__FilterPolicy_0013a288;
  pFVar1[1]._vptr_FilterPolicy = (_func_int **)(long)bits_per_key;
  uVar2 = (ulong)((double)bits_per_key * 0.69);
  uVar2 = (long)((double)bits_per_key * 0.69 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  pp_Var4 = (_func_int **)(uVar2 + (uVar2 == 0));
  pp_Var3 = (_func_int **)0x1e;
  if (pp_Var4 < (_func_int **)0x1e) {
    pp_Var3 = pp_Var4;
  }
  pFVar1[2]._vptr_FilterPolicy = pp_Var3;
  return pFVar1;
}

Assistant:

const FilterPolicy* NewBloomFilterPolicy(int bits_per_key) {
  return new BloomFilterPolicy(bits_per_key);
}